

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

char * merge(char *a,char *b,_func_int_char_ptr_char_ptr *cmp,int offset)

{
  int iVar1;
  char *local_38;
  char *head;
  char *ptr;
  int offset_local;
  _func_int_char_ptr_char_ptr *cmp_local;
  char *b_local;
  char *a_local;
  
  local_38 = b;
  if ((a != (char *)0x0) && (local_38 = a, b != (char *)0x0)) {
    iVar1 = (*cmp)(a,b);
    if (iVar1 < 1) {
      b_local = *(char **)(a + offset);
      head = a;
      cmp_local = (_func_int_char_ptr_char_ptr *)b;
    }
    else {
      cmp_local = *(_func_int_char_ptr_char_ptr **)(b + offset);
      head = b;
      b_local = a;
    }
    local_38 = head;
    while (b_local != (char *)0x0 && cmp_local != (_func_int_char_ptr_char_ptr *)0x0) {
      iVar1 = (*cmp)(b_local,(char *)cmp_local);
      if (iVar1 < 1) {
        *(char **)(head + offset) = b_local;
        head = b_local;
        b_local = *(char **)(b_local + offset);
      }
      else {
        *(_func_int_char_ptr_char_ptr **)(head + offset) = cmp_local;
        head = (char *)cmp_local;
        cmp_local = *(_func_int_char_ptr_char_ptr **)(cmp_local + offset);
      }
    }
    if (b_local == (char *)0x0) {
      *(_func_int_char_ptr_char_ptr **)(head + offset) = cmp_local;
    }
    else {
      *(char **)(head + offset) = b_local;
    }
  }
  return local_38;
}

Assistant:

static char *merge(
  char *a,
  char *b,
  int (*cmp)(const char*,const char*),
  int offset
){
  char *ptr, *head;

  if( a==0 ){
    head = b;
  }else if( b==0 ){
    head = a;
  }else{
    if( (*cmp)(a,b)<=0 ){
      ptr = a;
      a = NEXT(a);
    }else{
      ptr = b;
      b = NEXT(b);
    }
    head = ptr;
    while( a && b ){
      if( (*cmp)(a,b)<=0 ){
        NEXT(ptr) = a;
        ptr = a;
        a = NEXT(a);
      }else{
        NEXT(ptr) = b;
        ptr = b;
        b = NEXT(b);
      }
    }
    if( a ) NEXT(ptr) = a;
    else    NEXT(ptr) = b;
  }
  return head;
}